

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::FormatString<char[26],char_const*,char[12],unsigned_long,char[28],unsigned_long,char[2]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [26],char **Args_1,
          char (*Args_2) [12],unsigned_long *Args_3,char (*Args_4) [28],unsigned_long *Args_5,
          char (*Args_6) [2])

{
  stringstream local_1c0 [8];
  stringstream ss;
  char (*Args_local_4) [28];
  unsigned_long *Args_local_3;
  char (*Args_local_2) [12];
  char **Args_local_1;
  char (*Args_local) [26];
  
  std::__cxx11::stringstream::stringstream(local_1c0);
  FormatStrSS<std::__cxx11::stringstream,char[26],char_const*,char[12],unsigned_long,char[28],unsigned_long,char[2]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
             (char (*) [26])this,(char **)Args,(char (*) [12])Args_1,(unsigned_long *)Args_2,
             (char (*) [28])Args_3,(unsigned_long *)Args_4,(char (*) [2])Args_5);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1c0);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}